

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathCompareValues(xmlXPathParserContextPtr ctxt,int inf,int strict)

{
  double dVar1;
  double dVar2;
  xmlXPathObjectType xVar3;
  xmlXPathObjectType xVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  xmlXPathObjectPtr pxVar8;
  xmlXPathObjectPtr pxVar9;
  xmlXPathObjectPtr arg;
  double dVar10;
  double dVar11;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return 0;
  }
  if (ctxt->context == (xmlXPathContextPtr)0x0) {
    return 0;
  }
  iVar5 = ctxt->valueNr;
  lVar7 = (long)iVar5;
  if (lVar7 < 1) {
    pxVar8 = (xmlXPathObjectPtr)0x0;
  }
  else {
    ctxt->valueNr = iVar5 + -1;
    if (iVar5 == 1) {
      pxVar8 = (xmlXPathObjectPtr)0x0;
    }
    else {
      pxVar8 = ctxt->valueTab[lVar7 + -2];
    }
    ctxt->value = pxVar8;
    pxVar8 = ctxt->valueTab[lVar7 + -1];
    ctxt->valueTab[lVar7 + -1] = (xmlXPathObjectPtr)0x0;
  }
  iVar5 = ctxt->valueNr;
  lVar7 = (long)iVar5;
  if (lVar7 < 1) {
    pxVar9 = (xmlXPathObjectPtr)0x0;
  }
  else {
    ctxt->valueNr = iVar5 + -1;
    if (iVar5 == 1) {
      pxVar9 = (xmlXPathObjectPtr)0x0;
    }
    else {
      pxVar9 = ctxt->valueTab[lVar7 + -2];
    }
    ctxt->value = pxVar9;
    pxVar9 = ctxt->valueTab[lVar7 + -1];
    ctxt->valueTab[lVar7 + -1] = (xmlXPathObjectPtr)0x0;
  }
  if ((pxVar9 == (xmlXPathObjectPtr)0x0) || (pxVar8 == (xmlXPathObjectPtr)0x0)) {
    if (pxVar9 != (xmlXPathObjectPtr)0x0) {
      pxVar8 = pxVar9;
    }
    xmlXPathReleaseObject(ctxt->context,pxVar8);
    xmlXPathErr(ctxt,10);
    return 0;
  }
  xVar4 = pxVar8->type | XPATH_USERS;
  if (xVar4 != XPATH_XSLT_TREE) {
    xVar3 = pxVar9->type;
    if (xVar3 != XPATH_XSLT_TREE) {
      if (xVar3 != XPATH_NUMBER) {
        if (xVar3 == XPATH_NODESET) goto LAB_001c0038;
        xmlXPathValuePush(ctxt,pxVar9);
        xmlXPathNumberFunction(ctxt,1);
        iVar5 = ctxt->valueNr;
        lVar7 = (long)iVar5;
        if (lVar7 < 1) {
          pxVar9 = (xmlXPathObjectPtr)0x0;
        }
        else {
          ctxt->valueNr = iVar5 + -1;
          if (iVar5 == 1) {
            pxVar9 = (xmlXPathObjectPtr)0x0;
          }
          else {
            pxVar9 = ctxt->valueTab[lVar7 + -2];
          }
          ctxt->value = pxVar9;
          pxVar9 = ctxt->valueTab[lVar7 + -1];
          ctxt->valueTab[lVar7 + -1] = (xmlXPathObjectPtr)0x0;
        }
      }
      if (pxVar8->type != XPATH_NUMBER) {
        xmlXPathValuePush(ctxt,pxVar8);
        xmlXPathNumberFunction(ctxt,1);
        iVar5 = ctxt->valueNr;
        lVar7 = (long)iVar5;
        if (lVar7 < 1) {
          pxVar8 = (xmlXPathObjectPtr)0x0;
        }
        else {
          ctxt->valueNr = iVar5 + -1;
          if (iVar5 == 1) {
            pxVar8 = (xmlXPathObjectPtr)0x0;
          }
          else {
            pxVar8 = ctxt->valueTab[lVar7 + -2];
          }
          ctxt->value = pxVar8;
          pxVar8 = ctxt->valueTab[lVar7 + -1];
          ctxt->valueTab[lVar7 + -1] = (xmlXPathObjectPtr)0x0;
        }
      }
      if ((ctxt->error != 0) || (dVar1 = pxVar9->floatval, NAN(dVar1))) {
LAB_001c0133:
        uVar6 = 0;
        goto LAB_001c0135;
      }
      dVar2 = pxVar8->floatval;
      uVar6 = 0;
      if (NAN(dVar2)) goto LAB_001c0135;
      dVar10 = ABS(dVar1);
      uVar13 = ((0.0 < dVar1) - 1) + (uint)(0.0 < dVar1);
      if (dVar10 != INFINITY) {
        uVar13 = uVar6;
      }
      dVar11 = ABS(dVar2);
      uVar12 = ((0.0 < dVar2) - 1) + (uint)(0.0 < dVar2);
      if (dVar11 != INFINITY) {
        uVar12 = uVar6;
      }
      if (strict == 0 || inf == 0) {
        if (inf == 0 || strict != 0) {
          if (strict != 0 && inf == 0) {
            uVar6 = 1;
            if ((((0.0 < dVar1) && (uVar12 != 1)) && (dVar10 == INFINITY)) ||
               ((0.0 < dVar1 || dVar10 != INFINITY && (uVar12 == 0xffffffff)))) goto LAB_001c0135;
            bVar14 = dVar1 < dVar2;
            goto LAB_001c021a;
          }
          if (strict != 0 || inf != 0) goto LAB_001c0133;
          uVar6 = 1;
          if ((0.0 < dVar1 && dVar10 == INFINITY) || (uVar12 == 0xffffffff)) goto LAB_001c0135;
          bVar14 = dVar1 < dVar2;
        }
        else {
          uVar6 = 1;
          if ((uVar13 == 0xffffffff) || (0.0 < dVar2 && dVar11 == INFINITY)) goto LAB_001c0135;
          bVar14 = dVar2 < dVar1;
        }
        bVar14 = !bVar14;
      }
      else {
        uVar6 = 1;
        if (((uVar13 == 0xffffffff) && (0.0 < dVar2 || dVar11 != INFINITY)) ||
           ((uVar13 != 1 && ((0.0 < dVar2 && (dVar11 == INFINITY)))))) goto LAB_001c0135;
        bVar14 = dVar2 < dVar1;
LAB_001c021a:
        bVar14 = !bVar14 && dVar2 != dVar1;
      }
      uVar6 = (uint)(byte)((dVar10 != INFINITY && dVar11 != INFINITY) & bVar14);
LAB_001c0135:
      xmlXPathReleaseObject(ctxt->context,pxVar9);
      xmlXPathReleaseObject(ctxt->context,pxVar8);
      return uVar6;
    }
LAB_001c0038:
    if (xVar4 != XPATH_XSLT_TREE) goto LAB_001c003d;
  }
  if ((pxVar9->type | XPATH_USERS) == XPATH_XSLT_TREE) {
    iVar5 = xmlXPathCompareNodeSets(ctxt,inf,strict,pxVar9,pxVar8);
    return iVar5;
  }
LAB_001c003d:
  arg = pxVar9;
  if ((pxVar9->type | XPATH_USERS) != XPATH_XSLT_TREE) {
    inf = (int)(inf == 0);
    arg = pxVar8;
    pxVar8 = pxVar9;
  }
  iVar5 = xmlXPathCompareNodeSetValue(ctxt,inf,strict,arg,pxVar8);
  return iVar5;
}

Assistant:

int
xmlXPathCompareValues(xmlXPathParserContextPtr ctxt, int inf, int strict) {
    int ret = 0, arg1i = 0, arg2i = 0;
    xmlXPathObjectPtr arg1, arg2;

    if ((ctxt == NULL) || (ctxt->context == NULL)) return(0);
    arg2 = xmlXPathValuePop(ctxt);
    arg1 = xmlXPathValuePop(ctxt);
    if ((arg1 == NULL) || (arg2 == NULL)) {
	if (arg1 != NULL)
	    xmlXPathReleaseObject(ctxt->context, arg1);
	else
	    xmlXPathReleaseObject(ctxt->context, arg2);
	XP_ERROR0(XPATH_INVALID_OPERAND);
    }

    if ((arg2->type == XPATH_NODESET) || (arg2->type == XPATH_XSLT_TREE) ||
      (arg1->type == XPATH_NODESET) || (arg1->type == XPATH_XSLT_TREE)) {
	/*
	 * If either argument is a XPATH_NODESET or XPATH_XSLT_TREE the two arguments
	 * are not freed from within this routine; they will be freed from the
	 * called routine, e.g. xmlXPathCompareNodeSets or xmlXPathCompareNodeSetValue
	 */
	if (((arg2->type == XPATH_NODESET) || (arg2->type == XPATH_XSLT_TREE)) &&
	  ((arg1->type == XPATH_NODESET) || (arg1->type == XPATH_XSLT_TREE))){
	    ret = xmlXPathCompareNodeSets(ctxt, inf, strict, arg1, arg2);
	} else {
	    if ((arg1->type == XPATH_NODESET) || (arg1->type == XPATH_XSLT_TREE)) {
		ret = xmlXPathCompareNodeSetValue(ctxt, inf, strict,
			                          arg1, arg2);
	    } else {
		ret = xmlXPathCompareNodeSetValue(ctxt, !inf, strict,
			                          arg2, arg1);
	    }
	}
	return(ret);
    }

    if (arg1->type != XPATH_NUMBER) {
	xmlXPathValuePush(ctxt, arg1);
	xmlXPathNumberFunction(ctxt, 1);
	arg1 = xmlXPathValuePop(ctxt);
    }
    if (arg2->type != XPATH_NUMBER) {
	xmlXPathValuePush(ctxt, arg2);
	xmlXPathNumberFunction(ctxt, 1);
	arg2 = xmlXPathValuePop(ctxt);
    }
    if (ctxt->error)
        goto error;
    /*
     * Add tests for infinity and nan
     * => feedback on 3.4 for Inf and NaN
     */
    /* Hand check NaN and Infinity comparisons */
    if (xmlXPathIsNaN(arg1->floatval) || xmlXPathIsNaN(arg2->floatval)) {
	ret=0;
    } else {
	arg1i=xmlXPathIsInf(arg1->floatval);
	arg2i=xmlXPathIsInf(arg2->floatval);
	if (inf && strict) {
	    if ((arg1i == -1 && arg2i != -1) ||
		(arg2i == 1 && arg1i != 1)) {
		ret = 1;
	    } else if (arg1i == 0 && arg2i == 0) {
		ret = (arg1->floatval < arg2->floatval);
	    } else {
		ret = 0;
	    }
	}
	else if (inf && !strict) {
	    if (arg1i == -1 || arg2i == 1) {
		ret = 1;
	    } else if (arg1i == 0 && arg2i == 0) {
		ret = (arg1->floatval <= arg2->floatval);
	    } else {
		ret = 0;
	    }
	}
	else if (!inf && strict) {
	    if ((arg1i == 1 && arg2i != 1) ||
		(arg2i == -1 && arg1i != -1)) {
		ret = 1;
	    } else if (arg1i == 0 && arg2i == 0) {
		ret = (arg1->floatval > arg2->floatval);
	    } else {
		ret = 0;
	    }
	}
	else if (!inf && !strict) {
	    if (arg1i == 1 || arg2i == -1) {
		ret = 1;
	    } else if (arg1i == 0 && arg2i == 0) {
		ret = (arg1->floatval >= arg2->floatval);
	    } else {
		ret = 0;
	    }
	}
    }
error:
    xmlXPathReleaseObject(ctxt->context, arg1);
    xmlXPathReleaseObject(ctxt->context, arg2);
    return(ret);
}